

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O1

bool __thiscall
ON_ArithmeticCalculatorImplementation::AppendUnaryOperation
          (ON_ArithmeticCalculatorImplementation *this,double sign)

{
  if (this->m_error_condition == '\0') {
    if ((this->m_bPendingUnaryMinus == '\0') && (this->m_bPendingUnaryPlus == '\0')) {
      if ((sign == 1.0) && (!NAN(sign))) {
        this->m_bPendingUnaryPlus = '\x01';
        return true;
      }
      if ((sign == -1.0) && (!NAN(sign))) {
        this->m_bPendingUnaryMinus = '\x01';
        return true;
      }
    }
    this->m_op_stack_pointer = 0;
    this->m_expression_depth = 0;
    this->m_op_stack[0].m_x = 0.0;
    this->m_op_stack[0].m_op = op_unset;
    this->m_op_stack[0].m_level = 0;
    this->m_bPendingImpliedMultiplication = '\0';
    this->m_bPendingUnaryPlus = '\0';
    this->m_bPendingUnaryMinus = '\0';
    this->m_bUnsetValue = '\0';
    this->m_error_condition = '\x02';
  }
  return false;
}

Assistant:

bool ON_ArithmeticCalculatorImplementation::AppendUnaryOperation(
  double sign
  )
{
  bool rc = false;

  for(;;)
  {
    if ( m_error_condition)
      break;

    if ( m_bPendingUnaryMinus || m_bPendingUnaryPlus )
    {
      SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);
      break;
    }

    if ( 1.0 == sign )
    {
      m_bPendingUnaryPlus = true;
      rc = true;
      break;
    }

    if ( -1.0 == sign )
    {
      m_bPendingUnaryMinus = true;
      rc = true;
      break;
    }

    SetErrorCondition(ON_ArithmeticCalculator::invalid_expression_error);

    break;
  }

  return rc;
}